

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_crashes.cpp
# Opt level: O3

void __thiscall
CrashTest_DISABLED_MemoryTest_Test::TestBody(CrashTest_DISABLED_MemoryTest_Test *this)

{
  bool bVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  AssertHelper local_10;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      MemoryOverflow();
    }
  }
  testing::Message::Message((Message *)&local_18);
  testing::internal::AssertHelper::AssertHelper
            (&local_10,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_crashes.cpp"
             ,0x26,"Expected: MemoryOverflow() throws an exception.\n  Actual: it doesn\'t.");
  testing::internal::AssertHelper::operator=(&local_10,(Message *)&local_18);
  testing::internal::AssertHelper::~AssertHelper(&local_10);
  if (local_18.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_18.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_18.ptr_ + 8))();
    }
  }
  return;
}

Assistant:

TEST (CrashTest, DISABLED_MemoryTest) {
    ASSERT_ANY_THROW(MemoryOverflow());
}